

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

void __thiscall ArgsManager::AddCommand(ArgsManager *this,string *cmd,string *help)

{
  size_type sVar1;
  const_reference pvVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
  *this_00;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_bool>
  pVar3;
  allocator<char> local_a1;
  _Base_ptr local_a0;
  bool local_98 [8];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  undefined1 local_80 [64];
  uint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (cmd,'=',0);
  local_80[0] = (string)(sVar1 == 0xffffffffffffffff);
  inline_assertion_check<true,bool>
            ((bool *)local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x22a,"AddCommand","cmd.find(\'=\') == std::string::npos");
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (cmd,0);
  local_80[0] = (string)(*pvVar2 != '-');
  inline_assertion_check<true,bool>
            ((bool *)local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x22b,"AddCommand","cmd.at(0) != \'-\'");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock16,&this->cs_args,"cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x22d,false);
  this->m_accept_any_command = false;
  local_80._0_4_ = COMMANDS;
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
             *)std::
               map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
               ::operator[](&this->m_available_args,(key_type *)local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"",&local_a1);
  std::__cxx11::string::string((string *)(local_80 + 0x20),help);
  local_40 = 0x800;
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,ArgsManager::Arg>
                    (this_00,cmd,(Arg *)local_80);
  local_a0 = (_Base_ptr)pVar3.first._M_node;
  local_98[0] = pVar3.second;
  Arg::~Arg((Arg *)local_80);
  inline_assertion_check<true,bool&>
            (local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x231,"AddCommand","ret.second");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::AddCommand(const std::string& cmd, const std::string& help)
{
    Assert(cmd.find('=') == std::string::npos);
    Assert(cmd.at(0) != '-');

    LOCK(cs_args);
    m_accept_any_command = false; // latch to false
    std::map<std::string, Arg>& arg_map = m_available_args[OptionsCategory::COMMANDS];
    auto ret = arg_map.emplace(cmd, Arg{"", help, ArgsManager::COMMAND});
    Assert(ret.second); // Fail on duplicate commands
}